

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

void __thiscall
tchecker::clockbounds::local_lu_map_t::local_lu_map_t(local_lu_map_t *this,local_lu_map_t *m)

{
  uint uVar1;
  const_reference ppmVar2;
  map_t *pmVar3;
  reference ppmVar4;
  uint local_48;
  allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*> local_41;
  loc_id_t id;
  allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*> local_21;
  value_type local_20;
  local_lu_map_t *local_18;
  local_lu_map_t *m_local;
  local_lu_map_t *this_local;
  
  this->_loc_nb = m->_loc_nb;
  this->_clock_nb = m->_clock_nb;
  uVar1 = this->_loc_nb;
  local_20 = (value_type)0x0;
  local_18 = m;
  m_local = this;
  std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>::
  allocator(&local_21);
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::vector(&this->_L,(ulong)uVar1,&local_20,&local_21);
  std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>::
  ~allocator(&local_21);
  uVar1 = this->_loc_nb;
  _id = (value_type)0x0;
  std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>::
  allocator(&local_41);
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::vector(&this->_U,(ulong)uVar1,(value_type *)&id,&local_41);
  std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>::
  ~allocator(&local_41);
  for (local_48 = 0; local_48 < this->_loc_nb; local_48 = local_48 + 1) {
    ppmVar2 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&local_18->_L,(ulong)local_48);
    pmVar3 = clone_map(*ppmVar2);
    ppmVar4 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&this->_L,(ulong)local_48);
    *ppmVar4 = pmVar3;
    ppmVar2 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&local_18->_U,(ulong)local_48);
    pmVar3 = clone_map(*ppmVar2);
    ppmVar4 = std::
              vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
              ::operator[](&this->_U,(ulong)local_48);
    *ppmVar4 = pmVar3;
  }
  return;
}

Assistant:

local_lu_map_t::local_lu_map_t(tchecker::clockbounds::local_lu_map_t const & m)
    : _loc_nb(m._loc_nb), _clock_nb(m._clock_nb), _L(_loc_nb, nullptr), _U(_loc_nb, nullptr)
{
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id) {
    _L[id] = tchecker::clockbounds::clone_map(*m._L[id]);
    _U[id] = tchecker::clockbounds::clone_map(*m._U[id]);
  }
}